

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int clip_1d(int *x0,int *y0,int *x1,int *y1,int mindim,int maxdim)

{
  double dVar1;
  double m;
  int maxdim_local;
  int mindim_local;
  int *y1_local;
  int *x1_local;
  int *y0_local;
  int *x0_local;
  
  if (*x0 < mindim) {
    if (*x1 < mindim) {
      x0_local._4_4_ = 0;
    }
    else {
      dVar1 = (double)(*y1 - *y0) / (double)(*x1 - *x0);
      *y0 = *y0 - (int)(dVar1 * (double)(*x0 - mindim));
      *x0 = mindim;
      if (maxdim < *x1) {
        *y1 = (int)(dVar1 * (double)(maxdim - *x1) + (double)*y1);
        *x1 = maxdim;
      }
      x0_local._4_4_ = 1;
    }
  }
  else if (maxdim < *x0) {
    if (maxdim < *x1) {
      x0_local._4_4_ = 0;
    }
    else {
      dVar1 = (double)(*y1 - *y0) / (double)(*x1 - *x0);
      *y0 = (int)(dVar1 * (double)(maxdim - *x0)) + *y0;
      *x0 = maxdim;
      if (*x1 < mindim) {
        *y1 = *y1 - (int)(dVar1 * (double)(*x1 - mindim));
        *x1 = mindim;
      }
      x0_local._4_4_ = 1;
    }
  }
  else if (maxdim < *x1) {
    *y1 = (int)(((double)(*y1 - *y0) / (double)(*x1 - *x0)) * (double)(maxdim - *x1)) + *y1;
    *x1 = maxdim;
    x0_local._4_4_ = 1;
  }
  else if (*x1 < mindim) {
    *y1 = *y1 - (int)(((double)(*y1 - *y0) / (double)(*x1 - *x0)) * (double)(*x1 - mindim));
    *x1 = mindim;
    x0_local._4_4_ = 1;
  }
  else {
    x0_local._4_4_ = 1;
  }
  return x0_local._4_4_;
}

Assistant:

static int
clip_1d (int *x0, int *y0, int *x1, int *y1, int mindim, int maxdim)
{
	double m;			/* gradient of line */
	if (*x0 < mindim) {
		/* start of line is left of window */
		if (*x1 < mindim)		/* as is the end, so the line never cuts the window */
			return 0;
		m = (*y1 - *y0) / (double) (*x1 - *x0);	/* calculate the slope of the line */
		/* adjust x0 to be on the left boundary (ie to be zero), and y0 to match */
		*y0 -= (int)(m * (*x0 - mindim));
		*x0 = mindim;
		/* now, perhaps, adjust the far end of the line as well */
		if (*x1 > maxdim) {
			*y1 += m * (maxdim - *x1);
			*x1 = maxdim;
		}
		return 1;
	}
	if (*x0 > maxdim) {
		/* start of line is right of window -
		complement of above */
		if (*x1 > maxdim)		/* as is the end, so the line misses the window */
			return 0;
		m = (*y1 - *y0) / (double) (*x1 - *x0);	/* calculate the slope of the line */
		*y0 += (int)(m * (maxdim - *x0));	/* adjust so point is on the right
							   boundary */
		*x0 = maxdim;
		/* now, perhaps, adjust the end of the line */
		if (*x1 < mindim) {
			*y1 -= (int)(m * (*x1 - mindim));
			*x1 = mindim;
		}
		return 1;
	}
	/* the final case - the start of the line is inside the window */
	if (*x1 > maxdim) {
		/* other end is outside to the right */
		m = (*y1 - *y0) / (double) (*x1 - *x0);	/* calculate the slope of the line */
		*y1 += (int)(m * (maxdim - *x1));
		*x1 = maxdim;
		return 1;
	}
	if (*x1 < mindim) {
		/* other end is outside to the left */
		m = (*y1 - *y0) / (double) (*x1 - *x0);	/* calculate the slope of the line */
		*y1 -= (int)(m * (*x1 - mindim));
		*x1 = mindim;
		return 1;
	}
	/* only get here if both points are inside the window */
	return 1;
}